

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardsigmoid.cpp
# Opt level: O2

int __thiscall
ncnn::HardSigmoid::forward_inplace(HardSigmoid *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  void *pvVar9;
  float fVar10;
  
  uVar4 = bottom_top_blob->h * bottom_top_blob->w;
  uVar7 = 0;
  uVar5 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar5 = uVar7;
  }
  pvVar9 = bottom_top_blob->data;
  uVar6 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar6 = uVar7;
  }
  sVar2 = bottom_top_blob->cstep;
  sVar3 = bottom_top_blob->elemsize;
  for (; uVar7 != uVar6; uVar7 = uVar7 + 1) {
    for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
      fVar1 = *(float *)((long)pvVar9 + uVar8 * 4);
      fVar10 = 0.0;
      if ((this->lower <= fVar1) && (fVar10 = 1.0, fVar1 < this->upper || fVar1 == this->upper)) {
        fVar10 = fVar1 * this->alpha + this->beta;
      }
      *(float *)((long)pvVar9 + uVar8 * 4) = fVar10;
    }
    pvVar9 = (void *)((long)pvVar9 + sVar2 * sVar3);
  }
  return 0;
}

Assistant:

int HardSigmoid::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            if (ptr[i] < lower)
                ptr[i] = 0.f;
            else if (ptr[i] > upper)
                ptr[i] = 1.f;
            else
                ptr[i] = ptr[i] * alpha + beta;
        }
    }

    return 0;
}